

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_add_elements_raw_input_at
              (wally_tx *tx,uint32_t index,uchar *txhash,size_t txhash_len,uint32_t utxo_index,
              uint32_t sequence,uchar *script,size_t script_len,wally_tx_witness_stack *witness,
              uchar *nonce,size_t nonce_len,uchar *entropy,size_t entropy_len,uchar *issuance_amount
              ,size_t issuance_amount_len,uchar *inflation_keys,size_t inflation_keys_len,
              uchar *issuance_amount_rangeproof,size_t issuance_amount_rangeproof_len,
              uchar *inflation_keys_rangeproof,size_t inflation_keys_rangeproof_len,
              wally_tx_witness_stack *pegin_witness,uint32_t flags,_Bool is_elements)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  wally_tx_input local_108;
  
  local_108.script = script;
  local_108.script_len = script_len;
  local_108.witness = witness;
  local_108.features = is_elements;
  local_108.blinding_nonce[0] = '\0';
  local_108.blinding_nonce[1] = '\0';
  local_108.blinding_nonce[2] = '\0';
  local_108.blinding_nonce[3] = '\0';
  local_108.blinding_nonce[4] = '\0';
  local_108.blinding_nonce[5] = '\0';
  local_108.blinding_nonce[6] = '\0';
  local_108.blinding_nonce[7] = '\0';
  local_108.blinding_nonce[8] = '\0';
  local_108.blinding_nonce[9] = '\0';
  local_108.blinding_nonce[10] = '\0';
  local_108.blinding_nonce[0xb] = '\0';
  local_108.blinding_nonce[0xc] = '\0';
  local_108.blinding_nonce[0xd] = '\0';
  local_108.blinding_nonce[0xe] = '\0';
  local_108.blinding_nonce[0xf] = '\0';
  local_108.blinding_nonce[0x10] = '\0';
  local_108.blinding_nonce[0x11] = '\0';
  local_108.blinding_nonce[0x12] = '\0';
  local_108.blinding_nonce[0x13] = '\0';
  local_108.blinding_nonce[0x14] = '\0';
  local_108.blinding_nonce[0x15] = '\0';
  local_108.blinding_nonce[0x16] = '\0';
  local_108.blinding_nonce[0x17] = '\0';
  local_108.blinding_nonce[0x18] = '\0';
  local_108.blinding_nonce[0x19] = '\0';
  local_108.blinding_nonce[0x1a] = '\0';
  local_108.blinding_nonce[0x1b] = '\0';
  local_108.blinding_nonce[0x1c] = '\0';
  local_108.blinding_nonce[0x1d] = '\0';
  local_108.blinding_nonce[0x1e] = '\0';
  local_108.blinding_nonce[0x1f] = '\0';
  local_108.entropy[0] = '\0';
  local_108.entropy[1] = '\0';
  local_108.entropy[2] = '\0';
  local_108.entropy[3] = '\0';
  local_108.entropy[4] = '\0';
  local_108.entropy[5] = '\0';
  local_108.entropy[6] = '\0';
  local_108.entropy[7] = '\0';
  local_108.entropy[8] = '\0';
  local_108.entropy[9] = '\0';
  local_108.entropy[10] = '\0';
  local_108.entropy[0xb] = '\0';
  local_108.entropy[0xc] = '\0';
  local_108.entropy[0xd] = '\0';
  local_108.entropy[0xe] = '\0';
  local_108.entropy[0xf] = '\0';
  local_108.entropy[0x10] = '\0';
  local_108.entropy[0x11] = '\0';
  local_108.entropy[0x12] = '\0';
  local_108.entropy[0x13] = '\0';
  local_108.entropy[0x14] = '\0';
  local_108.entropy[0x15] = '\0';
  local_108.entropy[0x16] = '\0';
  local_108.entropy[0x17] = '\0';
  local_108.entropy[0x18] = '\0';
  local_108.entropy[0x19] = '\0';
  local_108.entropy[0x1a] = '\0';
  local_108.entropy[0x1b] = '\0';
  local_108.entropy[0x1c] = '\0';
  local_108.entropy[0x1d] = '\0';
  local_108.entropy[0x1e] = '\0';
  local_108.entropy[0x1f] = '\0';
  local_108.issuance_amount = issuance_amount;
  local_108.issuance_amount_len = issuance_amount_len;
  local_108.inflation_keys = inflation_keys;
  local_108.inflation_keys_len = inflation_keys_len;
  local_108.issuance_amount_rangeproof = issuance_amount_rangeproof;
  local_108.issuance_amount_rangeproof_len = issuance_amount_rangeproof_len;
  local_108.inflation_keys_rangeproof = inflation_keys_rangeproof;
  local_108.inflation_keys_rangeproof_len = inflation_keys_rangeproof_len;
  local_108.pegin_witness = pegin_witness;
  if (flags != 0) {
    return -2;
  }
  if (txhash_len != 0x20 || txhash == (uchar *)0x0) {
    return -2;
  }
  if ((nonce != (uchar *)0x0) == (nonce_len != 0x20)) {
    return -2;
  }
  if ((entropy != (uchar *)0x0) == (entropy_len != 0x20)) {
    return -2;
  }
  if ((issuance_amount != (uchar *)0x0) == (issuance_amount_len == 0)) {
    return -2;
  }
  if ((inflation_keys != (uchar *)0x0) == (inflation_keys_len == 0)) {
    return -2;
  }
  if ((issuance_amount_rangeproof != (uchar *)0x0) == (issuance_amount_rangeproof_len == 0)) {
    return -2;
  }
  if ((inflation_keys_rangeproof != (uchar *)0x0) == (inflation_keys_rangeproof_len == 0)) {
    return -2;
  }
  if ((utxo_index == 0xffffffff) && (*txhash == '\0')) {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 0x1e) {
        local_108.index = 0xffffffff;
        goto LAB_00178523;
      }
      uVar1 = uVar5 + 1;
      lVar2 = uVar5 + 2;
      uVar5 = uVar1;
    } while (txhash[lVar2] == '\0');
    local_108.index = (uVar1 < 0x1f && is_elements) - 1 | 0x3fffffff;
    if (uVar1 < 0x1f) goto LAB_001784af;
LAB_00178523:
    bVar3 = is_elements | 8;
  }
  else {
    local_108.index = utxo_index & 0x3fffffff;
    if (!is_elements) {
      local_108.index = utxo_index;
    }
LAB_001784af:
    if (!is_elements) goto LAB_00178529;
    bVar3 = (char)((int)utxo_index >> 0x1f) * -2 | 5;
    if ((utxo_index >> 0x1e & 1) == 0) {
      bVar3 = is_elements | 2;
    }
    if (utxo_index < 0x40000000) goto LAB_00178529;
  }
  local_108.features = bVar3;
LAB_00178529:
  local_108.txhash._0_8_ = *(undefined8 *)txhash;
  local_108.txhash._8_8_ = *(undefined8 *)(txhash + 8);
  local_108.txhash._16_8_ = *(undefined8 *)(txhash + 0x10);
  local_108.txhash._24_8_ = *(undefined8 *)(txhash + 0x18);
  if (nonce != (uchar *)0x0) {
    local_108.blinding_nonce._0_8_ = *(undefined8 *)nonce;
    local_108.blinding_nonce._8_8_ = *(undefined8 *)(nonce + 8);
    local_108.blinding_nonce._16_8_ = *(undefined8 *)(nonce + 0x10);
    local_108.blinding_nonce._24_8_ = *(undefined8 *)(nonce + 0x18);
  }
  if (entropy != (uchar *)0x0) {
    local_108.entropy._0_8_ = *(undefined8 *)entropy;
    local_108.entropy._8_8_ = *(undefined8 *)(entropy + 8);
    local_108.entropy._16_8_ = *(undefined8 *)(entropy + 0x10);
    local_108.entropy._24_8_ = *(undefined8 *)(entropy + 0x18);
  }
  local_108.sequence = sequence;
  iVar4 = wally_tx_add_input_at(tx,index,&local_108);
  wally_clear(&local_108,0xd0);
  return iVar4;
}

Assistant:

static int tx_add_elements_raw_input_at(
    struct wally_tx *tx, uint32_t index,
    const unsigned char *txhash, size_t txhash_len,
    uint32_t utxo_index, uint32_t sequence,
    const unsigned char *script, size_t script_len,
    const struct wally_tx_witness_stack *witness,
    const unsigned char *nonce, size_t nonce_len,
    const unsigned char *entropy, size_t entropy_len,
    const unsigned char *issuance_amount, size_t issuance_amount_len,
    const unsigned char *inflation_keys, size_t inflation_keys_len,
    const unsigned char *issuance_amount_rangeproof, size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof, size_t inflation_keys_rangeproof_len,
    const struct wally_tx_witness_stack *pegin_witness,
    uint32_t flags, bool is_elements)
{
    /* Add an input without allocating a temporary wally_tx_input */
    struct wally_tx_input input = {
        { 0 }, utxo_index, sequence,
        (unsigned char *)script, script_len,
        (struct wally_tx_witness_stack *) witness,
        is_elements ? WALLY_TX_IS_ELEMENTS : 0,
#ifdef BUILD_ELEMENTS
        { 0 }, { 0 }, (unsigned char *) issuance_amount,
        issuance_amount_len,
        (unsigned char *) inflation_keys,
        inflation_keys_len,
        (unsigned char *) issuance_amount_rangeproof,
        issuance_amount_rangeproof_len,
        (unsigned char *) inflation_keys_rangeproof,
        inflation_keys_rangeproof_len,
        (struct wally_tx_witness_stack *) pegin_witness
#endif /* BUILD_ELEMENTS */
    };
    bool is_coinbase;
    int ret;
#ifndef BUILD_ELEMENTS
    (void)pegin_witness;
#endif

    if (flags)
        return WALLY_EINVAL; /* TODO: Allow creation of p2pkh/p2sh using flags */

    if (!txhash || txhash_len != WALLY_TXHASH_LEN ||
        BYTES_INVALID_N(nonce, nonce_len, WALLY_TX_ASSET_TAG_LEN) ||
        BYTES_INVALID_N(entropy, entropy_len, WALLY_TX_ASSET_TAG_LEN) ||
        BYTES_INVALID(issuance_amount, issuance_amount_len) ||
        BYTES_INVALID(inflation_keys, inflation_keys_len) ||
        BYTES_INVALID(issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        BYTES_INVALID(inflation_keys_rangeproof, inflation_keys_rangeproof_len))
        return WALLY_EINVAL;

    is_coinbase = is_coinbase_bytes(txhash, txhash_len, utxo_index);
    if (is_elements && !is_coinbase)
        input.index = utxo_index & WALLY_TX_INDEX_MASK;
    else
        input.index = utxo_index;
    if (is_coinbase)
        input.features |= WALLY_TX_IS_COINBASE;
    else if (is_elements) {
        if (utxo_index & WALLY_TX_ISSUANCE_FLAG)
            input.features |= WALLY_TX_IS_ISSUANCE;
        if (utxo_index & WALLY_TX_PEGIN_FLAG)
            input.features |= WALLY_TX_IS_PEGIN;
    }

    memcpy(input.txhash, txhash, WALLY_TXHASH_LEN);
#ifdef BUILD_ELEMENTS
    if (nonce)
        memcpy(input.blinding_nonce, nonce, WALLY_TX_ASSET_TAG_LEN);
    if (entropy)
        memcpy(input.entropy, entropy, WALLY_TX_ASSET_TAG_LEN);
#endif /* BUILD_ELEMENTS */
    ret = wally_tx_add_input_at(tx, index, &input);
    wally_clear(&input, sizeof(input));
    return ret;
}